

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O3

Break * __thiscall
wasm::Builder::makeBreak(Builder *this,Name name,Expression *value,Expression *condition)

{
  Break *this_00;
  
  this_00 = (Break *)MixedArena::allocSpace(&this->wasm->allocator,0x30,8);
  (this_00->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression._id = BreakId;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression.type.id = 1;
  (this_00->name).super_IString.str._M_len = name.super_IString.str._M_len;
  (this_00->name).super_IString.str._M_str = name.super_IString.str._M_str;
  this_00->value = value;
  this_00->condition = condition;
  Break::finalize(this_00);
  return this_00;
}

Assistant:

Break* makeBreak(Name name,
                   Expression* value = nullptr,
                   Expression* condition = nullptr) {
    auto* ret = wasm.allocator.alloc<Break>();
    ret->name = name;
    ret->value = value;
    ret->condition = condition;
    ret->finalize();
    return ret;
  }